

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

EnumValueDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindEnumValueByNumber
          (FileDescriptorTables *this,EnumDescriptor *parent,int number)

{
  bool bVar1;
  EnumValueDescriptor *pEVar2;
  reference ppEVar3;
  Nonnull<const_char_*> pcVar4;
  int iVar5;
  long v2;
  const_iterator it;
  iterator local_40;
  iterator local_30;
  
  if ((long)parent->value_count_ < 1) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,(long)parent->value_count_,"index < value_count()");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    iVar5 = parent->values_->number_;
    if ((number < iVar5) || ((long)parent->sequential_value_limit_ + (long)iVar5 < (long)number)) {
      local_30.ctrl_ = (ctrl_t *)parent;
      local_30.field_1._0_4_ = number;
      local_40 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                 ::find<google::protobuf::(anonymous_namespace)::ParentNumberQuery>
                           (&(this->enum_values_by_number_).
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                            ,(key_arg<google::protobuf::(anonymous_namespace)::ParentNumberQuery> *)
                             &local_30);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ::AssertNotDebugCapacity
                (&(this->enum_values_by_number_).
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                );
      local_30.ctrl_ = (ctrl_t *)0x0;
      bVar1 = absl::lts_20250127::container_internal::operator==(&local_40,&local_30);
      if (bVar1) {
        pEVar2 = (EnumValueDescriptor *)0x0;
      }
      else {
        ppEVar3 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ::iterator::operator*(&local_40);
        pEVar2 = *ppEVar3;
      }
      return pEVar2;
    }
    iVar5 = number - iVar5;
    v2 = (long)iVar5;
    if (iVar5 < 0) {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>(0,v2,"0 <= index");
    }
    else {
      pcVar4 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar4 == (Nonnull<const_char_*>)0x0) {
      if (iVar5 < parent->value_count_) {
        pcVar4 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (v2,(long)parent->value_count_,"index < value_count()");
      }
      if (pcVar4 == (Nonnull<const_char_*>)0x0) {
        return parent->values_ + v2;
      }
      goto LAB_001e670f;
    }
  }
  else {
    FindEnumValueByNumber();
  }
  FindEnumValueByNumber();
LAB_001e670f:
  FindEnumValueByNumber();
}

Assistant:

inline const EnumValueDescriptor* FileDescriptorTables::FindEnumValueByNumber(
    const EnumDescriptor* parent, int number) const {
  // If `number` is within the sequential range, just index into the parent
  // without doing a table lookup.
  const int base = parent->value(0)->number();
  if (base <= number &&
      number <= static_cast<int64_t>(base) + parent->sequential_value_limit_) {
    return parent->value(number - base);
  }

  auto it = enum_values_by_number_.find(ParentNumberQuery{{parent, number}});
  return it == enum_values_by_number_.end() ? nullptr : *it;
}